

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O3

void nuraft::free_buffer(buffer *buf)

{
  int iVar1;
  stat_mgr *psVar2;
  stat_elem *psVar3;
  string local_40;
  
  if (free_buffer(nuraft::buffer*)::num_active == '\0') {
    iVar1 = __cxa_guard_acquire(&free_buffer(nuraft::buffer*)::num_active);
    if (iVar1 != 0) {
      psVar2 = stat_mgr::get_instance();
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"num_active_buffers","");
      psVar3 = stat_mgr::create_stat(psVar2,COUNTER,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      free_buffer::num_active = psVar3;
      __cxa_guard_release(&free_buffer(nuraft::buffer*)::num_active);
    }
  }
  if (free_buffer(nuraft::buffer*)::amount_active == '\0') {
    iVar1 = __cxa_guard_acquire(&free_buffer(nuraft::buffer*)::amount_active);
    if (iVar1 != 0) {
      psVar2 = stat_mgr::get_instance();
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"amount_active_buffers","");
      psVar3 = stat_mgr::create_stat(psVar2,COUNTER,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      free_buffer::amount_active = psVar3;
      __cxa_guard_release(&free_buffer(nuraft::buffer*)::amount_active);
    }
  }
  operator_delete__(buf);
  return;
}

Assistant:

static void free_buffer(buffer* buf) {
    static stat_elem& num_active = *stat_mgr::get_instance()->create_stat
        (stat_elem::COUNTER, "num_active_buffers");
    static stat_elem& amount_active = *stat_mgr::get_instance()->create_stat
        (stat_elem::COUNTER, "amount_active_buffers");

    num_active--;
    amount_active -= buf->container_size();

    delete[] reinterpret_cast<char*>(buf);
}